

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O3

void __thiscall DHUDMessage::Draw(DHUDMessage *this,int bottom,int visibility)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  float intpart;
  int local_40;
  uint local_3c;
  int local_38;
  float local_34;
  
  if ((this->VisibilityFlags & visibility) != 0) {
    return;
  }
  (*(this->super_DObject)._vptr_DObject[8])();
  iVar4 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
  local_38 = 1;
  if (this->HUDWidth == 0) {
    iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar2 = active_con_scaletext();
    bVar9 = iVar2 == 0;
    if (bVar9) {
      local_38 = CleanXfac;
      local_40 = CleanYfac;
    }
    else {
      if (this->HUDWidth != 0) goto LAB_004bca4f;
      iVar2 = active_con_scaletext();
      iVar3 = iVar3 / iVar2;
      iVar2 = active_con_scaletext();
      iVar4 = iVar4 / iVar2;
      iVar2 = active_con_scaletext();
      bottom = bottom / iVar2;
      local_40 = 1;
      local_38 = 1;
    }
    if (this->HUDWidth == 0) {
      fVar10 = this->Left;
      if (fVar10 <= 0.0) {
        fVar10 = -fVar10;
      }
      else {
        iVar3 = iVar3 - this->Width * local_38;
      }
      local_3c = (uint)(fVar10 * (float)iVar3);
      fVar10 = this->Top;
      if (fVar10 <= 0.0) {
        fVar10 = -fVar10;
        iVar3 = bottom;
      }
      else {
        iVar3 = bottom - this->Height * local_40;
      }
      uVar1 = (uint)(fVar10 * (float)iVar3);
      goto LAB_004bcc10;
    }
  }
  else {
LAB_004bca4f:
    bVar9 = false;
    local_40 = 1;
  }
  fVar10 = modff(this->Left,&local_34);
  local_3c = (uint)local_34;
  uVar1 = (int)(ABS(fVar10) * 10.0 + 0.5) & 3;
  if (uVar1 == 2) {
    local_3c = local_3c - this->Width;
  }
  else if (uVar1 == 0) {
    local_3c = local_3c - this->Width / 2;
  }
  fVar10 = modff(this->Top,&local_34);
  uVar1 = (uint)local_34;
  uVar5 = (int)(ABS(fVar10) * 10.0 + 0.5) & 3;
  if (uVar5 == 2) {
    uVar1 = uVar1 - this->Height;
  }
  else if (uVar5 == 0) {
    uVar1 = uVar1 - this->Height / 2;
  }
LAB_004bcc10:
  if (this->CenterX == true) {
    local_3c = local_3c + (this->Width * local_38) / 2;
  }
  iVar3 = this->Font->FontHeight;
  iVar2 = this->HUDHeight;
  if ((long)iVar2 < 0) {
    uVar6 = (ulong)(uint)-iVar2;
  }
  else {
    uVar6 = ((long)iVar2 * (long)iVar4) / (long)bottom;
  }
  CalcClipCoords(this,(int)uVar6);
  if (0 < this->NumLines) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      uVar5 = local_3c;
      if (this->CenterX == true) {
        uVar5 = local_3c - (*(int *)((long)&this->Lines->Width + lVar7) * local_38) / 2;
      }
      (*(this->super_DObject)._vptr_DObject[9])
                (this,uVar8 & 0xffffffff,(ulong)uVar5,(ulong)uVar1,bVar9,uVar6 & 0xffffffff);
      uVar1 = uVar1 + local_40 * iVar3;
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while ((long)uVar8 < (long)this->NumLines);
  }
  return;
}

Assistant:

void DHUDMessage::Draw (int bottom, int visibility)
{
	int xscale, yscale;
	int x, y;
	int ystep;
	int i;
	bool clean = false;
	int hudheight;

	// If any of the visibility flags match, do NOT draw this message.
	if (VisibilityFlags & visibility)
	{
		return;
	}

	DrawSetup ();

	int screen_width = SCREENWIDTH;
	int screen_height = SCREENHEIGHT;
	if (HUDWidth == 0 && active_con_scaletext() == 0)
	{
		clean = true;
		xscale = CleanXfac;
		yscale = CleanYfac;
	}
	else
	{
		xscale = yscale = 1;
		if (HUDWidth == 0)
		{
			screen_width /= active_con_scaletext();
			screen_height /= active_con_scaletext();
			bottom /= active_con_scaletext();
		}
	}

	if (HUDWidth == 0)
	{
		if (Left > 0.f)
		{ // Position center
			x = (int)((float)(screen_width - Width * xscale) * Left);
		}
		else
		{ // Position edge
			x = (int)((float)screen_width * -Left);
		}
		if (Top > 0.f)
		{ // Position center
			y = (int)((float)(bottom - Height * yscale) * Top);
		}
		else
		{ // Position edge
			y = (int)((float)bottom * -Top);
		}
	}
	else
	{
		float intpart;
		int fracpart;

		fracpart = (int)(fabsf (modff (Left, &intpart)) * 10.f + 0.5f);
		x = (int)intpart;
		switch (fracpart & 3)
		{
		case 0: // Position center
			x -= Width / 2;
			break;

		case 2: // Position right
			x -= Width;
			break;
		}

		fracpart = (int)(fabsf (modff (Top, &intpart)) * 10.f + 0.5f);
		y = (int)intpart;
		switch (fracpart & 3)
		{
		case 0: // Position center
			y -= Height / 2;
			break;

		case 2: // Position bottom
			y -= Height;
			break;
		}
	}

	if (CenterX)
	{
		x += Width * xscale / 2;
	}

	ystep = Font->GetHeight() * yscale;

	if (HUDHeight < 0)
	{ // A negative height means the HUD size covers the status bar
		hudheight = -HUDHeight;
	}
	else
	{ // A positive height means the HUD size does not cover the status bar
		hudheight = Scale (HUDHeight, screen_height, bottom);
	}
	CalcClipCoords(hudheight);

	for (i = 0; i < NumLines; i++)
	{
		int drawx;

		drawx = CenterX ? x - Lines[i].Width*xscale/2 : x;
		DoDraw (i, drawx, y, clean, hudheight);
		y += ystep;
	}
}